

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase694::run(TestCase694 *this)

{
  size_t sVar1;
  word *pwVar2;
  size_t sVar3;
  word *pwVar4;
  bool bVar5;
  ArrayPtr<const_unsigned_int> value;
  Reader value_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar6;
  char *local_1b0;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  bool local_178;
  Builder local_170;
  Builder root;
  OrphanBuilder local_130;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  sVar1 = (AVar6.ptr)->size_;
  pwVar2 = (AVar6.ptr)->ptr;
  _kjCondition.left = 0xc;
  _kjCondition._4_4_ = 0x22;
  _kjCondition.right = CONCAT44(_kjCondition.right._4_4_,0x38);
  value.size_ = 3;
  value.ptr = &_kjCondition.left;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List(&root,value);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  sVar3 = (AVar6.ptr)->size_;
  pwVar4 = (AVar6.ptr)->ptr;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&root,value_00);
  AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  _kjCondition.right = AVar6.size_;
  _kjCondition.left = 1;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 1;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_1b0 = (char *)CONCAT44(local_1b0._4_4_,1);
    AVar6 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
    local_170._0_8_ = AVar6.size_;
    kj::_::Debug::
    log<char_const(&)[65],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2c0,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", _kjCondition, 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               &_kjCondition,(uint *)&local_1b0,(unsigned_long *)&local_170);
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownUInt32List
            ((Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&local_130,&root);
  OrphanBuilder::~OrphanBuilder(&local_130);
  bVar5 = allZero(pwVar2 + sVar1,pwVar4 + sVar3);
  _kjCondition.left._0_1_ = bVar5;
  if ((!bVar5) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[47],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2c4,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\", _kjCondition",
               (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)",
               (DebugExpression<bool> *)&_kjCondition);
  }
  local_1b0 = "foo";
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_170,&root);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&local_1b0,&local_170);
  if ((local_178 == false) && (kj::_::Debug::minSeverity < 3)) {
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_170,&root);
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2c6,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", _kjCondition, \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [4])"foo",&local_170);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, ListsZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  root.setUInt32List({12, 34, 56});
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownUInt32List();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}